

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSort.c
# Opt level: O3

void sort_rec2(int *array,int size)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  int *array_00;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  array_00 = array;
  if (0xf < size) {
    do {
      uVar8 = size;
      iVar5 = array_00[uVar8 >> 1];
      lVar6 = -1;
      uVar3 = (ulong)uVar8;
      while( true ) {
        lVar6 = (long)(int)lVar6;
        array = array_00 + lVar6;
        do {
          lVar6 = lVar6 + 1;
          iVar1 = array[1];
          array = array + 1;
        } while (iVar1 < iVar5);
        uVar3 = (ulong)(int)uVar3;
        do {
          lVar2 = uVar3 - 1;
          uVar3 = uVar3 - 1;
        } while (iVar5 < array_00[lVar2]);
        if ((long)uVar3 <= lVar6) break;
        *array = array_00[lVar2];
        array_00[uVar3] = iVar1;
      }
      iVar5 = (int)lVar6;
      sort_rec2(array_00,iVar5);
      array_00 = array;
      size = uVar8 - iVar5;
    } while (0xf < (int)(uVar8 - iVar5));
    size = uVar8 - iVar5;
  }
  if (1 < size) {
    uVar4 = 1;
    uVar3 = 0;
    do {
      uVar9 = uVar3 & 0xffffffff;
      uVar7 = uVar4;
      do {
        uVar8 = (uint)uVar7;
        if (array[(int)(uint)uVar9] <= array[uVar7]) {
          uVar8 = (uint)uVar9;
        }
        uVar7 = uVar7 + 1;
        uVar9 = (ulong)uVar8;
      } while ((uint)size != uVar7);
      iVar5 = array[uVar3];
      array[uVar3] = array[(int)uVar8];
      uVar3 = uVar3 + 1;
      array[(int)uVar8] = iVar5;
      uVar4 = uVar4 + 1;
    } while (uVar3 != size - 1);
  }
  return;
}

Assistant:

static void sort_rec2(int* array, int size)
{
    if (size <= 15)
        selectionsort2(array, size);
    else{
        int    pivot = array[size/2];
        int    tmp;
        int    i = -1;
        int    j = size;
        for(;;){
            do i++; while(array[i] < pivot);
            do j--; while(pivot < array[j]);
            if (i >= j) break;
            tmp = array[i]; array[i] = array[j]; array[j] = tmp;
        }
        sort_rec2(array    , i     );
        sort_rec2(&array[i], size-i);
    }
}